

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall Array::printArray(Array *this)

{
  int iVar1;
  int local_18;
  int local_14;
  int j;
  int i;
  Array *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = getHeight(this);
    if (iVar1 <= local_14) break;
    local_18 = 0;
    while( true ) {
      iVar1 = getWidth(this);
      if (iVar1 <= local_18) break;
      printf("%4d",(ulong)(uint)this->_data[local_14][local_18]);
      local_18 = local_18 + 1;
    }
    printf("\n");
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Array::printArray()
{
	for (int i = 0; i < getHeight(); ++i) {
		for (int j = 0; j < getWidth(); ++j) {
			printf("%4d", _data[i][j]);
		}
		printf("\n");
	}
}